

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecmult_impl.h
# Opt level: O0

int secp256k1_ecmult_wnaf(int *wnaf,int len,secp256k1_scalar *a,int w)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  int in_ECX;
  uint64_t *in_RDX;
  int in_ESI;
  void *in_RDI;
  int word;
  int now;
  int carry;
  int sign;
  int bit;
  int last_set_bit;
  secp256k1_scalar s;
  secp256k1_scalar *in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffac;
  uint uVar4;
  int iVar5;
  uint local_48;
  uint local_44;
  secp256k1_scalar local_40;
  int local_1c;
  uint64_t *local_18;
  int local_c;
  void *local_8;
  
  local_44 = 0xffffffff;
  local_48 = 0;
  iVar5 = 1;
  uVar4 = 0;
  local_1c = in_ECX;
  local_18 = in_RDX;
  local_c = in_ESI;
  local_8 = in_RDI;
  memset(in_RDI,0,(long)in_ESI << 2);
  local_40.d[0] = *local_18;
  local_40.d[1] = local_18[1];
  local_40.d[2] = local_18[2];
  local_40.d[3] = local_18[3];
  uVar1 = secp256k1_scalar_get_bits(&local_40,0xff,1);
  if (uVar1 != 0) {
    secp256k1_scalar_negate
              ((secp256k1_scalar *)CONCAT44(iVar5,uVar4),
               (secp256k1_scalar *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
    iVar5 = -1;
  }
  while ((int)local_48 < local_c) {
    uVar1 = secp256k1_scalar_get_bits(&local_40,local_48,1);
    if (uVar1 == uVar4) {
      local_48 = local_48 + 1;
    }
    else {
      iVar2 = local_1c;
      if ((int)(local_c - local_48) < local_1c) {
        iVar2 = local_c - local_48;
      }
      uVar1 = secp256k1_scalar_get_bits_var(in_stack_ffffffffffffff98,0,0x119ed5);
      iVar3 = uVar1 + uVar4;
      uVar4 = iVar3 >> ((byte)local_1c - 1 & 0x1f) & 1;
      *(uint *)((long)local_8 + (long)(int)local_48 * 4) =
           iVar5 * (iVar3 - (uVar4 << ((byte)local_1c & 0x1f)));
      local_44 = local_48;
      local_48 = iVar2 + local_48;
    }
  }
  return local_44 + 1;
}

Assistant:

static int secp256k1_ecmult_wnaf(int *wnaf, int len, const secp256k1_scalar *a, int w) {
    secp256k1_scalar s;
    int last_set_bit = -1;
    int bit = 0;
    int sign = 1;
    int carry = 0;

    VERIFY_CHECK(wnaf != NULL);
    VERIFY_CHECK(0 <= len && len <= 256);
    VERIFY_CHECK(a != NULL);
    VERIFY_CHECK(2 <= w && w <= 31);

    memset(wnaf, 0, len * sizeof(wnaf[0]));

    s = *a;
    if (secp256k1_scalar_get_bits(&s, 255, 1)) {
        secp256k1_scalar_negate(&s, &s);
        sign = -1;
    }

    while (bit < len) {
        int now;
        int word;
        if (secp256k1_scalar_get_bits(&s, bit, 1) == (unsigned int)carry) {
            bit++;
            continue;
        }

        now = w;
        if (now > len - bit) {
            now = len - bit;
        }

        word = secp256k1_scalar_get_bits_var(&s, bit, now) + carry;

        carry = (word >> (w-1)) & 1;
        word -= carry << w;

        wnaf[bit] = sign * word;
        last_set_bit = bit;

        bit += now;
    }
#ifdef VERIFY
    {
        int verify_bit = bit;

        VERIFY_CHECK(carry == 0);

        while (verify_bit < 256) {
            VERIFY_CHECK(secp256k1_scalar_get_bits(&s, verify_bit, 1) == 0);
            verify_bit++;
        }
    }
#endif
    return last_set_bit + 1;
}